

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkFragmentShadingRateAttachmentInfoKHR *create_info,ScratchAllocator *alloc)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  void *pvVar3;
  VkExtent2D VVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  
  puVar8 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar8 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar3 = create_info->pNext;
    VVar4 = create_info->shadingRateAttachmentTexelSize;
    puVar8[2] = create_info->pFragmentShadingRateAttachment;
    *(VkExtent2D *)(puVar8 + 3) = VVar4;
    *puVar8 = uVar2;
    puVar8[1] = pvVar3;
  }
  puVar1 = (undefined8 *)puVar8[2];
  puVar10 = puVar8;
  if (puVar1 != (undefined8 *)0x0) {
    puVar9 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
    if (puVar9 != (undefined8 *)0x0) {
      uVar2 = *puVar1;
      uVar5 = puVar1[1];
      uVar6 = puVar1[3];
      puVar9[2] = puVar1[2];
      puVar9[3] = uVar6;
      *puVar9 = uVar2;
      puVar9[1] = uVar5;
    }
    bVar7 = copy_pnext_chain(this,(void *)puVar9[1],alloc,(void **)(puVar9 + 1),
                             (DynamicStateInfo *)0x0,0);
    puVar10 = (undefined8 *)0x0;
    if (bVar7) {
      puVar8[2] = puVar9;
      puVar10 = puVar8;
    }
  }
  return puVar10;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkFragmentShadingRateAttachmentInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *resolve = copy(create_info, 1, alloc);
	if (resolve->pFragmentShadingRateAttachment)
	{
		auto *att = copy(resolve->pFragmentShadingRateAttachment, 1, alloc);
		if (!copy_pnext_chain(att->pNext, alloc, &att->pNext, nullptr, 0))
			return nullptr;
		resolve->pFragmentShadingRateAttachment = att;
	}

	return resolve;
}